

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O1

int tunnel_recv_callback
              (nghttp2_session *session,uint8_t flags,int32_t stream_id,uint8_t *mem,size_t len,
              void *userp)

{
  ssize_t sVar1;
  int iVar2;
  CURLcode result;
  CURLcode local_c;
  
  iVar2 = -0x386;
  if (*(int *)(*(long *)((long)userp + 0x10) + 0x120) == stream_id) {
    sVar1 = Curl_bufq_write((bufq *)(*(long *)((long)userp + 0x10) + 0x98),mem,len,&local_c);
    iVar2 = -0x386;
    if (local_c == CURLE_AGAIN) {
      iVar2 = 0;
    }
    if (-1 < sVar1) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int tunnel_recv_callback(nghttp2_session *session, uint8_t flags,
                                int32_t stream_id,
                                const uint8_t *mem, size_t len, void *userp)
{
  struct Curl_cfilter *cf = userp;
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  ssize_t nwritten;
  CURLcode result;

  (void)flags;
  (void)session;
  DEBUGASSERT(stream_id); /* should never be a zero stream ID here */

  if(stream_id != ctx->tunnel.stream_id)
    return NGHTTP2_ERR_CALLBACK_FAILURE;

  nwritten = Curl_bufq_write(&ctx->tunnel.recvbuf, mem, len, &result);
  if(nwritten < 0) {
    if(result != CURLE_AGAIN)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    nwritten = 0;
  }
  DEBUGASSERT((size_t)nwritten == len);
  return 0;
}